

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void ED25519_keypair_from_seed(uint8_t *out_public_key,uint8_t *out_private_key,uint8_t *seed)

{
  undefined1 local_108 [8];
  ge_p3 A;
  uint8_t az [64];
  uint8_t *seed_local;
  uint8_t *out_private_key_local;
  uint8_t *out_public_key_local;
  
  SHA512(seed,0x20,(uchar *)(A.T.v + 4));
  A.T.v[4]._0_1_ = (byte)A.T.v[4] & 0xf8;
  x25519_ge_scalarmult_base((ge_p3 *)local_108,(uint8_t *)(A.T.v + 4));
  ge_p3_tobytes(out_public_key,(ge_p3 *)local_108);
  OPENSSL_memcpy(out_private_key,seed,0x20);
  OPENSSL_memcpy(out_private_key + 0x20,out_public_key,0x20);
  return;
}

Assistant:

void ED25519_keypair_from_seed(uint8_t out_public_key[32],
                               uint8_t out_private_key[64],
                               const uint8_t seed[32]) {
  uint8_t az[SHA512_DIGEST_LENGTH];
  SHA512(seed, 32, az);

  az[0] &= 248;
  az[31] &= 127;
  az[31] |= 64;

  ge_p3 A;
  x25519_ge_scalarmult_base(&A, az);
  ge_p3_tobytes(out_public_key, &A);
  // The public key is derived from the private key, but it is public.
  CONSTTIME_DECLASSIFY(out_public_key, 32);

  OPENSSL_memcpy(out_private_key, seed, 32);
  OPENSSL_memcpy(out_private_key + 32, out_public_key, 32);
}